

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O2

ai_real Assimp::ComputePositionEpsilon(aiMesh *pMesh)

{
  aiVector3t<float> local_30;
  aiVector3t<float> local_20;
  
  local_20.x = 0.0;
  local_20.y = 0.0;
  local_20.z = 0.0;
  local_30.x = 0.0;
  local_30.y = 0.0;
  local_30.z = 0.0;
  ArrayBounds<aiVector3t<float>>(pMesh->mVertices,pMesh->mNumVertices,&local_20,&local_30);
  return SQRT((local_30.z - local_20.z) * (local_30.z - local_20.z) +
              (local_30.x - local_20.x) * (local_30.x - local_20.x) +
              (local_30.y - local_20.y) * (local_30.y - local_20.y)) * 0.0001;
}

Assistant:

ai_real ComputePositionEpsilon(const aiMesh* pMesh)
{
    const ai_real epsilon = ai_real( 1e-4 );

    // calculate the position bounds so we have a reliable epsilon to check position differences against
    aiVector3D minVec, maxVec;
    ArrayBounds(pMesh->mVertices,pMesh->mNumVertices,minVec,maxVec);
    return (maxVec - minVec).Length() * epsilon;
}